

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_parsecfg.c
# Opt level: O0

int parseconfig(char *filename,GlobalConfig *global)

{
  char cVar1;
  undefined8 uVar2;
  bool bVar3;
  GlobalConfig *pGVar4;
  _Bool _Var5;
  int iVar6;
  char *pcVar7;
  size_t sVar8;
  void *pvVar9;
  char *pcVar10;
  bool bVar11;
  char *reason;
  ParameterError local_90;
  _Bool alloced_param;
  int res;
  _Bool fileerror;
  dynbuf buf;
  _Bool dashed_option;
  char *pcStack_60;
  int lineno;
  char *param;
  char *option;
  char *line;
  char *home;
  char *pathalloc;
  OperationConfig *operation;
  int rc;
  _Bool usedarg;
  FILE *file;
  GlobalConfig *global_local;
  char *filename_local;
  
  _rc = (FILE *)0x0;
  operation._7_1_ = 0;
  operation._0_4_ = 0;
  pathalloc = &global->last->remote_time;
  home = (char *)0x0;
  file = (FILE *)global;
  global_local = (GlobalConfig *)filename;
  if ((filename == (char *)0x0) || (*filename == '\0')) {
    pcVar7 = homedir(".curlrc");
    pGVar4 = global_local;
    if ((pcVar7 != (char *)0x0) &&
       (home = (char *)curl_maprintf("%s%s.curlrc",pcVar7,"/"), pGVar4 = (GlobalConfig *)home,
       (GlobalConfig *)home == (GlobalConfig *)0x0)) {
      free(pcVar7);
      return 1;
    }
    global_local = pGVar4;
    free(pcVar7);
  }
  if ((_rc == (FILE *)0x0) && (global_local != (GlobalConfig *)0x0)) {
    iVar6 = strcmp((char *)global_local,"-");
    if (iVar6 == 0) {
      _rc = _stdin;
    }
    else {
      _rc = fopen64((char *)global_local,"r");
    }
  }
  if (_rc == (FILE *)0x0) {
    operation._0_4_ = 1;
  }
  else {
    buf.toobig._4_4_ = 0;
    curlx_dyn_init((dynbuf *)&res,0x19000);
    while (_Var5 = my_get_line((FILE *)_rc,(dynbuf *)&res,&alloced_param), _Var5) {
      bVar3 = false;
      buf.toobig._4_4_ = buf.toobig._4_4_ + 1;
      option = curlx_dyn_ptr((dynbuf *)&res);
      if (option == (char *)0x0) {
        operation._0_4_ = 1;
        break;
      }
      while( true ) {
        pcVar7 = option;
        bVar11 = false;
        if (*option != '\0') {
          iVar6 = Curl_isspace((uint)(byte)*option);
          bVar11 = iVar6 != 0;
        }
        if (!bVar11) break;
        option = option + 1;
      }
      cVar1 = *option;
      if (((((cVar1 == '\0') || (cVar1 == '\n')) || (cVar1 == '\r')) ||
          ((cVar1 == '#' || (cVar1 == '*')))) || (cVar1 == '/')) {
        curlx_dyn_reset((dynbuf *)&res);
      }
      else {
        buf.toobig._3_1_ = *option == '-';
        while( true ) {
          bVar11 = false;
          if (*option != '\0') {
            iVar6 = Curl_isspace((uint)(byte)*option);
            bVar11 = false;
            if (iVar6 == 0) {
              bVar11 = false;
              if (((buf.toobig._3_1_ & 1) == 0) && (bVar11 = true, *option != '=')) {
                bVar11 = *option == ':';
              }
              bVar11 = (bool)(bVar11 ^ 1);
            }
          }
          if (!bVar11) break;
          option = option + 1;
        }
        if (*option != '\0') {
          *option = '\0';
          option = option + 1;
        }
        while( true ) {
          pcVar10 = option;
          bVar11 = false;
          if (*option != '\0') {
            iVar6 = Curl_isspace((uint)(byte)*option);
            bVar11 = true;
            if (((iVar6 == 0) && (bVar11 = false, (buf.toobig._3_1_ & 1) == 0)) &&
               (bVar11 = true, *option != '=')) {
              bVar11 = *option == ':';
            }
          }
          if (!bVar11) break;
          option = option + 1;
        }
        if (*option == '\"') {
          sVar8 = strlen(option + 1);
          pcStack_60 = (char *)malloc(sVar8 + 1);
          if (pcStack_60 == (char *)0x0) {
            operation._0_4_ = 1;
            break;
          }
          bVar3 = true;
          unslashquote(option + 1,pcStack_60);
        }
        else {
          pcStack_60 = option;
          while( true ) {
            bVar11 = false;
            if (*option != '\0') {
              iVar6 = Curl_isspace((uint)(byte)*option);
              bVar11 = iVar6 == 0;
            }
            if (!bVar11) break;
            option = option + 1;
          }
          if (*option != '\0') {
            *option = '\0';
            do {
              option = option + 1;
              bVar11 = false;
              if (*option != '\0') {
                iVar6 = Curl_isspace((uint)(byte)*option);
                bVar11 = iVar6 != 0;
              }
            } while (bVar11);
            cVar1 = *option;
            if (((cVar1 != '\0') && (cVar1 != '\n')) && ((cVar1 != '\r' && (cVar1 != '#')))) {
              warnf(*(GlobalConfig **)(pathalloc + 0x4d0),
                    "%s:%d: warning: \'%s\' uses unquoted whitespace in the line that may cause side-effects!\n"
                    ,global_local,(ulong)buf.toobig._4_4_,pcVar7);
            }
          }
          if (*pcVar10 == '\0') {
            pcStack_60 = (char *)0x0;
          }
        }
        local_90 = getparameter(pcVar7,pcStack_60,(_Bool *)((long)&operation + 7),
                                (GlobalConfig *)file,(OperationConfig *)pathalloc);
        pathalloc = *(char **)&file->_fileno;
        if (((local_90 == PARAM_OK) && (pcStack_60 != (char *)0x0)) &&
           ((*pcStack_60 != '\0' && ((operation._7_1_ & 1) == 0)))) {
          local_90 = PARAM_GOT_EXTRA_PARAMETER;
        }
        if (((local_90 == PARAM_NEXT_OPERATION) && (*(long *)(pathalloc + 0x1d8) != 0)) &&
           (*(long *)(*(long *)(pathalloc + 0x1d8) + 8) != 0)) {
          pvVar9 = malloc(0x538);
          *(void **)(pathalloc + 0x4e0) = pvVar9;
          if (*(long *)(pathalloc + 0x4e0) == 0) {
            local_90 = PARAM_NO_MEM;
          }
          else {
            config_init(*(OperationConfig **)(pathalloc + 0x4e0));
            *(FILE **)(*(long *)(pathalloc + 0x4e0) + 0x4d0) = file;
            uVar2 = *(undefined8 *)(pathalloc + 0x4e0);
            file->_fileno = (int)uVar2;
            file->_flags2 = (int)((ulong)uVar2 >> 0x20);
            *(char **)(*(long *)(pathalloc + 0x4e0) + 0x4d8) = pathalloc;
            pathalloc = *(char **)(pathalloc + 0x4e0);
          }
        }
        if ((local_90 != PARAM_OK) && (local_90 != PARAM_NEXT_OPERATION)) {
          iVar6 = strcmp((char *)global_local,"-");
          if (iVar6 == 0) {
            global_local = (GlobalConfig *)anon_var_dwarf_cb1e;
          }
          if (((local_90 != PARAM_HELP_REQUESTED) && (local_90 != PARAM_MANUAL_REQUESTED)) &&
             ((local_90 != PARAM_VERSION_INFO_REQUESTED && (local_90 != PARAM_ENGINES_REQUESTED))))
          {
            pcVar10 = param2text(local_90);
            warnf(*(GlobalConfig **)(pathalloc + 0x4d0),"%s:%d: warning: \'%s\' %s\n",global_local,
                  (ulong)buf.toobig._4_4_,pcVar7,pcVar10);
          }
        }
        if (bVar3) {
          free(pcStack_60);
        }
        curlx_dyn_reset((dynbuf *)&res);
      }
    }
    curlx_dyn_free((dynbuf *)&res);
    if (_rc != _stdin) {
      fclose(_rc);
    }
    if ((alloced_param & 1U) != 0) {
      operation._0_4_ = 1;
    }
  }
  curl_free(home);
  return (int)operation;
}

Assistant:

int parseconfig(const char *filename, struct GlobalConfig *global)
{
  FILE *file = NULL;
  bool usedarg = FALSE;
  int rc = 0;
  struct OperationConfig *operation = global->last;
  char *pathalloc = NULL;

  if(!filename || !*filename) {
    /* NULL or no file name attempts to load .curlrc from the homedir! */

    char *home = homedir(".curlrc");
#ifndef WIN32
    if(home) {
      pathalloc = curl_maprintf("%s%s.curlrc", home, DIR_CHAR);
      if(!pathalloc) {
        free(home);
        return 1; /* out of memory */
      }
      filename = pathalloc;
    }
#else /* Windows */
    if(home) {
      int i = 0;
      char prefix = '.';
      do {
        /* if it was allocated in a previous attempt */
        curl_free(pathalloc);
        /* check for .curlrc then _curlrc in the home dir */
        pathalloc = curl_maprintf("%s%s%ccurlrc", home, DIR_CHAR, prefix);
        if(!pathalloc) {
          free(home);
          return 1; /* out of memory */
        }

        /* Check if the file exists - if not, try _curlrc */
        file = fopen(pathalloc, FOPEN_READTEXT);
        if(file) {
          filename = pathalloc;
          break;
        }
        prefix = '_';
      } while(++i < 2);
    }
    if(!filename) {
      /* check for .curlrc then _curlrc in the dir of the executable */
      file = execpath(".curlrc");
      if(!file)
        file = execpath("_curlrc");
    }
#endif

    Curl_safefree(home); /* we've used it, now free it */
  }

  if(!file && filename) { /* no need to fopen() again */
    if(strcmp(filename, "-"))
      file = fopen(filename, FOPEN_READTEXT);
    else
      file = stdin;
  }

  if(file) {
    char *line;
    char *option;
    char *param;
    int lineno = 0;
    bool dashed_option;
    struct curlx_dynbuf buf;
    bool fileerror;
    curlx_dyn_init(&buf, MAX_CONFIG_LINE_LENGTH);

    while(my_get_line(file, &buf, &fileerror)) {
      int res;
      bool alloced_param = FALSE;
      lineno++;
      line = curlx_dyn_ptr(&buf);
      if(!line) {
        rc = 1; /* out of memory */
        break;
      }

      /* line with # in the first non-blank column is a comment! */
      while(*line && ISSPACE(*line))
        line++;

      switch(*line) {
      case '#':
      case '/':
      case '\r':
      case '\n':
      case '*':
      case '\0':
        curlx_dyn_reset(&buf);
        continue;
      }

      /* the option keywords starts here */
      option = line;

      /* the option starts with a dash? */
      dashed_option = option[0]=='-'?TRUE:FALSE;

      while(*line && !ISSPACE(*line) && !ISSEP(*line, dashed_option))
        line++;
      /* ... and has ended here */

      if(*line)
        *line++ = '\0'; /* null-terminate, we have a local copy of the data */

#ifdef DEBUG_CONFIG
      fprintf(stderr, "GOT: %s\n", option);
#endif

      /* pass spaces and separator(s) */
      while(*line && (ISSPACE(*line) || ISSEP(*line, dashed_option)))
        line++;

      /* the parameter starts here (unless quoted) */
      if(*line == '\"') {
        /* quoted parameter, do the quote dance */
        line++;
        param = malloc(strlen(line) + 1); /* parameter */
        if(!param) {
          /* out of memory */
          rc = 1;
          break;
        }
        alloced_param = TRUE;
        (void)unslashquote(line, param);
      }
      else {
        param = line; /* parameter starts here */
        while(*line && !ISSPACE(*line))
          line++;

        if(*line) {
          *line = '\0'; /* null-terminate */

          /* to detect mistakes better, see if there's data following */
          line++;
          /* pass all spaces */
          while(*line && ISSPACE(*line))
            line++;

          switch(*line) {
          case '\0':
          case '\r':
          case '\n':
          case '#': /* comment */
            break;
          default:
            warnf(operation->global, "%s:%d: warning: '%s' uses unquoted "
                  "whitespace in the line that may cause side-effects!\n",
                  filename, lineno, option);
          }
        }
        if(!*param)
          /* do this so getparameter can check for required parameters.
             Otherwise it always thinks there's a parameter. */
          param = NULL;
      }

#ifdef DEBUG_CONFIG
      fprintf(stderr, "PARAM: \"%s\"\n",(param ? param : "(null)"));
#endif
      res = getparameter(option, param, &usedarg, global, operation);
      operation = global->last;

      if(!res && param && *param && !usedarg)
        /* we passed in a parameter that wasn't used! */
        res = PARAM_GOT_EXTRA_PARAMETER;

      if(res == PARAM_NEXT_OPERATION) {
        if(operation->url_list && operation->url_list->url) {
          /* Allocate the next config */
          operation->next = malloc(sizeof(struct OperationConfig));
          if(operation->next) {
            /* Initialise the newly created config */
            config_init(operation->next);

            /* Set the global config pointer */
            operation->next->global = global;

            /* Update the last operation pointer */
            global->last = operation->next;

            /* Move onto the new config */
            operation->next->prev = operation;
            operation = operation->next;
          }
          else
            res = PARAM_NO_MEM;
        }
      }

      if(res != PARAM_OK && res != PARAM_NEXT_OPERATION) {
        /* the help request isn't really an error */
        if(!strcmp(filename, "-")) {
          filename = "<stdin>";
        }
        if(res != PARAM_HELP_REQUESTED &&
           res != PARAM_MANUAL_REQUESTED &&
           res != PARAM_VERSION_INFO_REQUESTED &&
           res != PARAM_ENGINES_REQUESTED) {
          const char *reason = param2text(res);
          warnf(operation->global, "%s:%d: warning: '%s' %s\n",
                filename, lineno, option, reason);
        }
      }

      if(alloced_param)
        Curl_safefree(param);

      curlx_dyn_reset(&buf);
    }
    curlx_dyn_free(&buf);
    if(file != stdin)
      fclose(file);
    if(fileerror)
      rc = 1;
  }
  else
    rc = 1; /* couldn't open the file */

  curl_free(pathalloc);
  return rc;
}